

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int I420Interpolate(uint8_t *src0_y,int src0_stride_y,uint8_t *src0_u,int src0_stride_u,
                   uint8_t *src0_v,int src0_stride_v,uint8_t *src1_y,int src1_stride_y,
                   uint8_t *src1_u,int src1_stride_u,uint8_t *src1_v,int src1_stride_v,
                   uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
                   int dst_stride_v,int width,int height,int interpolation)

{
  int iVar1;
  uint width_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar6._0_4_ = -(uint)((int)dst_y == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)dst_y >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)dst_u == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)dst_u >> 0x20) == 0);
  auVar9._4_4_ = auVar6._0_4_;
  auVar9._0_4_ = auVar6._4_4_;
  auVar9._8_4_ = auVar6._12_4_;
  auVar9._12_4_ = auVar6._8_4_;
  auVar8._0_4_ = -(uint)((int)src1_u == 0);
  auVar8._4_4_ = -(uint)((int)((ulong)src1_u >> 0x20) == 0);
  auVar8._8_4_ = -(uint)((int)src1_v == 0);
  auVar8._12_4_ = -(uint)((int)((ulong)src1_v >> 0x20) == 0);
  auVar7._4_4_ = auVar8._0_4_;
  auVar7._0_4_ = auVar8._4_4_;
  auVar7._8_4_ = auVar8._12_4_;
  auVar7._12_4_ = auVar8._8_4_;
  auVar8 = packssdw(auVar7 & auVar8,auVar9 & auVar6);
  auVar4._0_4_ = -(uint)((int)src0_v == 0);
  auVar4._4_4_ = -(uint)((int)((ulong)src0_v >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)src1_y == 0);
  auVar4._12_4_ = -(uint)((int)((ulong)src1_y >> 0x20) == 0);
  auVar5._4_4_ = auVar4._0_4_;
  auVar5._0_4_ = auVar4._4_4_;
  auVar5._8_4_ = auVar4._12_4_;
  auVar5._12_4_ = auVar4._8_4_;
  auVar3._0_4_ = -(uint)((int)src0_y == 0);
  auVar3._4_4_ = -(uint)((int)((ulong)src0_y >> 0x20) == 0);
  auVar3._8_4_ = -(uint)((int)src0_u == 0);
  auVar3._12_4_ = -(uint)((int)((ulong)src0_u >> 0x20) == 0);
  auVar2._4_4_ = auVar3._0_4_;
  auVar2._0_4_ = auVar3._4_4_;
  auVar2._8_4_ = auVar3._12_4_;
  auVar2._12_4_ = auVar3._8_4_;
  auVar3 = packssdw(auVar2 & auVar3,auVar5 & auVar4);
  auVar3 = packssdw(auVar3,auVar8);
  iVar1 = -1;
  if ((height != 0 && (0 < width && dst_v != (uint8_t *)0x0)) &&
      ((((((((auVar3 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar3 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar3 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar3 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar3 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar3 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar3 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar3[0xf])) {
    iVar1 = height + 1 >> 1;
    width_00 = width + 1U >> 1;
    InterpolatePlane(src0_y,src0_stride_y,src1_y,src1_stride_y,dst_y,dst_stride_y,width,height,
                     interpolation);
    InterpolatePlane(src0_u,src0_stride_u,src1_u,src1_stride_u,dst_u,dst_stride_u,width_00,iVar1,
                     interpolation);
    InterpolatePlane(src0_v,src0_stride_v,src1_v,src1_stride_v,dst_v,dst_stride_v,width_00,iVar1,
                     interpolation);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420Interpolate(const uint8_t* src0_y,
                    int src0_stride_y,
                    const uint8_t* src0_u,
                    int src0_stride_u,
                    const uint8_t* src0_v,
                    int src0_stride_v,
                    const uint8_t* src1_y,
                    int src1_stride_y,
                    const uint8_t* src1_u,
                    int src1_stride_u,
                    const uint8_t* src1_v,
                    int src1_stride_v,
                    uint8_t* dst_y,
                    int dst_stride_y,
                    uint8_t* dst_u,
                    int dst_stride_u,
                    uint8_t* dst_v,
                    int dst_stride_v,
                    int width,
                    int height,
                    int interpolation) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src0_y || !src0_u || !src0_v || !src1_y || !src1_u || !src1_v ||
      !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }
  InterpolatePlane(src0_y, src0_stride_y, src1_y, src1_stride_y, dst_y,
                   dst_stride_y, width, height, interpolation);
  InterpolatePlane(src0_u, src0_stride_u, src1_u, src1_stride_u, dst_u,
                   dst_stride_u, halfwidth, halfheight, interpolation);
  InterpolatePlane(src0_v, src0_stride_v, src1_v, src1_stride_v, dst_v,
                   dst_stride_v, halfwidth, halfheight, interpolation);
  return 0;
}